

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

void hta::throw_exception<hta::Exception,char_const*,unsigned_long,char_const*,unsigned_long>
               (char *args,unsigned_long args_1,char *args_2,unsigned_long args_3)

{
  Exception *this;
  string local_1e8;
  make_exception<const_char_*,_unsigned_long,_const_char_*,_unsigned_long> local_1b1;
  stringstream local_1b0 [8];
  stringstream msg;
  unsigned_long args_local_3;
  char *args_local_2;
  unsigned_long args_local_1;
  char *args_local;
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  detail::make_exception<const_char_*,_unsigned_long,_const_char_*,_unsigned_long>::operator()
            (&local_1b1,(stringstream *)local_1b0,args,args_1,args_2,args_3);
  this = (Exception *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringstream::str();
  Exception::Exception(this,&local_1e8);
  __cxa_throw(this,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

[[noreturn]] inline void throw_exception(Args... args)
{
    std::stringstream msg;

    detail::make_exception<Args...>()(msg, args...);

    throw E(msg.str());
}